

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ExtraLogging.cpp
# Opt level: O2

bool __thiscall RenX_ExtraLoggingPlugin::initialize(RenX_ExtraLoggingPlugin *this)

{
  undefined1 *this_00;
  string *this_01;
  string *this_02;
  bool bVar1;
  FILE *pFVar2;
  string_view in_key;
  string_view in_key_00;
  string_view in_key_01;
  string_view in_key_02;
  allocator<char> local_d1;
  string logFile;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->field_0x38;
  string_printf_abi_cxx11_
            (&local_50,"[%.*s] %.*s",*(undefined8 *)(RenX::tags + 0x15b0),
             *(undefined8 *)(RenX::tags + 0x15a8),*(undefined8 *)(RenX::tags + 0x1730),
             *(undefined8 *)(RenX::tags + 0x1728));
  in_key._M_str = "FilePrefix";
  in_key._M_len = 10;
  Jupiter::Config::get<std::__cxx11::string>(&logFile,(Config *)this_00,in_key,&local_50);
  this_01 = &this->filePrefix;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (this_01,&logFile);
  std::__cxx11::string::~string((string *)&logFile);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_70,this_01);
  in_key_00._M_str = "ConsolePrefix";
  in_key_00._M_len = 0xd;
  Jupiter::Config::get<std::__cxx11::string>(&logFile,(Config *)this_00,in_key_00,&local_70);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->consolePrefix,&logFile);
  std::__cxx11::string::~string((string *)&logFile);
  std::__cxx11::string::~string((string *)&local_70);
  string_printf_abi_cxx11_
            (&local_90,"Time: %.*s %.*s",*(undefined8 *)(RenX::tags + 0x15b0),
             *(undefined8 *)(RenX::tags + 0x15a8),*(undefined8 *)(RenX::tags + 0x1590),
             *(undefined8 *)(RenX::tags + 0x1588));
  in_key_01._M_str = "NewDayFormat";
  in_key_01._M_len = 0xc;
  Jupiter::Config::get<std::__cxx11::string>(&logFile,(Config *)this_00,in_key_01,&local_90);
  this_02 = &this->newDayFmt;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (this_02,&logFile);
  std::__cxx11::string::~string((string *)&logFile);
  std::__cxx11::string::~string((string *)&local_90);
  in_key_02._M_str = "PrintToConsole";
  in_key_02._M_len = 0xe;
  bVar1 = Jupiter::Config::get<bool>((Config *)this_00,in_key_02,true);
  this->printToConsole = bVar1;
  line._0_16_ = Jupiter::Config::get(this_00,7,"LogFile");
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&logFile,(basic_string_view<char,_std::char_traits<char>_> *)&line,&local_d1)
  ;
  RenX::sanitizeTags((string *)this_01);
  RenX::sanitizeTags((string *)&this->consolePrefix);
  RenX::sanitizeTags((string *)this_02);
  if (logFile._M_string_length == 0) {
    this->file = (FILE *)0x0;
    pFVar2 = (FILE *)0x0;
  }
  else {
    pFVar2 = fopen(logFile._M_dataplus._M_p,"a+b");
    this->file = (FILE *)pFVar2;
    if ((pFVar2 != (FILE *)0x0) && ((this->newDayFmt)._M_string_length != 0)) {
      std::__cxx11::string::string((string *)&line,this_02);
      RenX::processTags((string *)&line,(Server *)0x0,(PlayerInfo *)0x0,(PlayerInfo *)0x0,
                        (BuildingInfo *)0x0);
      fwrite(line._M_dataplus._M_p,1,line._M_string_length,(FILE *)this->file);
      fputs("\r\n",(FILE *)this->file);
      std::__cxx11::string::~string((string *)&line);
      pFVar2 = (FILE *)this->file;
    }
  }
  bVar1 = this->printToConsole;
  std::__cxx11::string::~string((string *)&logFile);
  return (bool)(pFVar2 != (FILE *)0x0 | bVar1 & 1U);
}

Assistant:

bool RenX_ExtraLoggingPlugin::initialize() {
	RenX_ExtraLoggingPlugin::filePrefix = this->config.get("FilePrefix"sv, string_printf("[%.*s] %.*s", RenX::tags->timeTag.size(),
		RenX::tags->timeTag.data(), RenX::tags->serverPrefixTag.size(),
		RenX::tags->serverPrefixTag.data()));
	RenX_ExtraLoggingPlugin::consolePrefix = this->config.get("ConsolePrefix"sv, RenX_ExtraLoggingPlugin::filePrefix);
	RenX_ExtraLoggingPlugin::newDayFmt = this->config.get("NewDayFormat"sv, string_printf("Time: %.*s %.*s", RenX::tags->timeTag.size(),
		RenX::tags->timeTag.data(), RenX::tags->dateTag.size(),
		RenX::tags->dateTag.data()));
	RenX_ExtraLoggingPlugin::printToConsole = this->config.get<bool>("PrintToConsole"sv, true);
	const std::string logFile = static_cast<std::string>(this->config.get("LogFile"sv));

	RenX::sanitizeTags(RenX_ExtraLoggingPlugin::filePrefix);
	RenX::sanitizeTags(RenX_ExtraLoggingPlugin::consolePrefix);
	RenX::sanitizeTags(RenX_ExtraLoggingPlugin::newDayFmt);

	if (!logFile.empty()) {
		RenX_ExtraLoggingPlugin::file = fopen(logFile.c_str(), "a+b");
		if (RenX_ExtraLoggingPlugin::file != nullptr && !RenX_ExtraLoggingPlugin::newDayFmt.empty()) {
			std::string line = RenX_ExtraLoggingPlugin::newDayFmt;
			RenX::processTags(line);
			fwrite(line.data(), sizeof(char), line.size(), file);
			fputs("\r\n", file);
		}
	}
	else
		RenX_ExtraLoggingPlugin::file = nullptr;

	return RenX_ExtraLoggingPlugin::file != nullptr || RenX_ExtraLoggingPlugin::printToConsole;
}